

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  longdouble *plVar1;
  _Head_base<0UL,_long_double_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  longdouble lVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
  _Var8;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_false>
  _Var9;
  col_value cVar10;
  undefined8 extraout_RAX;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  long lVar17;
  int *piVar18;
  type it;
  rc_data *__last;
  long lVar19;
  long lVar20;
  rc_data *ret;
  ulong uVar21;
  long lVar22;
  longdouble lVar23;
  longdouble lVar24;
  double dVar25;
  undefined1 local_a8 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_98;
  long local_90;
  int local_84;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
  *local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_78;
  long local_70;
  int *local_68;
  int *local_60;
  long local_58;
  unique_ptr<int[],_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  longdouble local_3c;
  
  local_3c = theta;
  if (first._M_current != last._M_current) {
    local_80 = this + 8;
    lVar23 = kappa / ((longdouble)1 - kappa);
    local_78._M_head_impl = (col_value *)this;
    local_68 = last._M_current;
    do {
      _Var16._M_head_impl = (int *)(long)*first._M_current;
      if (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
            *)this)->m <= *first._M_current) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        goto LAB_001a1293;
      }
      local_60 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a8,(int)local_80);
      uVar13 = 0;
      local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)_Var16._M_head_impl;
      if (local_a8._8_8_ != local_a8._0_8_) {
        _Var2._M_head_impl =
             (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                *)this)->P)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        _Var16._M_head_impl = (int *)local_a8._8_8_;
        do {
          iVar15 = *_Var16._M_head_impl;
          _Var16._M_head_impl = _Var16._M_head_impl + 8;
          _Var2._M_head_impl[iVar15] = _Var2._M_head_impl[iVar15] * local_3c;
        } while (_Var16._M_head_impl != (int *)local_a8._0_8_);
        uVar13 = 0;
        if (local_a8._8_8_ != local_a8._0_8_) {
          uVar7 = 1;
          uVar13 = 0;
          _Var16._M_head_impl = (int *)local_a8._8_8_;
          do {
            uVar12 = uVar13;
            uVar21 = (ulong)uVar7;
            sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,(int)local_80);
            _Var3._M_head_impl =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            lVar24 = (longdouble)0;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_48._M_head_impl
                != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              do {
                iVar15 = *local_48._M_head_impl;
                local_48._M_head_impl = local_48._M_head_impl + 2;
                local_84 = _Var3._M_head_impl[iVar15];
                lVar24 = (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                            *)this)->P)._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl[iVar15] *
                         (longdouble)local_84 + lVar24;
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_48._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_50._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
            }
            _Var8._M_head_impl =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var8._M_head_impl[uVar12].id = (int)uVar12;
            iVar15 = *_Var16._M_head_impl;
            _Var16._M_head_impl = _Var16._M_head_impl + 2;
            _Var8._M_head_impl[uVar12].a = _Var3._M_head_impl[iVar15];
            _Var8._M_head_impl[uVar12].value =
                 (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                    *)this)->c->linear_elements)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl
                 [*(int *)(local_a8._8_8_ + 4)] - lVar24;
            uVar13 = uVar12 + 1;
            uVar7 = uVar7 + 1;
          } while (_Var16._M_head_impl != (int *)local_a8._0_8_);
          if (uVar12 != 0) {
            __g = ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var8._M_head_impl,_Var8._M_head_impl + (uVar13 & 0xffffffff),
                       (int)LZCOUNT(uVar13 & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var8._M_head_impl,_Var8._M_head_impl + (uVar13 & 0xffffffff));
            __last = _Var8._M_head_impl + 1;
            lVar17 = uVar21 * 0x20 + -0x20;
            do {
              if (((_Var8._M_head_impl)->value != __last->value) ||
                 (NAN((_Var8._M_head_impl)->value) || NAN(__last->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var8._M_head_impl,__last,__g);
                _Var8._M_head_impl = __last;
              }
              __last = __last + 1;
              lVar17 = lVar17 + -0x20;
            } while (lVar17 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var8._M_head_impl,__last,__g);
          }
        }
      }
      _Var9._M_head_impl =
           (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_false>
           ._M_head_impl;
      local_70 = (long)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl * 3;
      iVar15 = (int)uVar13;
      if (_Var9._M_head_impl
          [(long)local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl].min < 1) {
        lVar17 = 0xffffffff;
        iVar14 = 0;
LAB_001a1086:
        uVar7 = (uint)lVar17;
        iVar11 = uVar7 + 1;
        if ((iVar11 < iVar15) && (iVar14 <= (&(_Var9._M_head_impl)->max)[local_70])) {
          local_90 = (long)iVar15;
          cVar10 = *(col_value *)((long)this + 0x50);
          lVar22 = (long)(int)uVar7 << 5;
          lVar20 = (long)(int)uVar7 + 1;
          do {
            lVar17 = lVar20;
            iVar14 = iVar14 + *(int *)((long)cVar10 + 0x34 + lVar22);
            if (iVar14 < *(int *)((long)*(col_value *)((long)this + 0x58) + local_70 * 4)) {
              piVar18 = (int *)(local_a8._8_8_ +
                               (long)*(int *)((long)cVar10 + 0x30 + lVar22) * 2 * 4);
LAB_001a1184:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar18[1]);
              *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar18 * 0x10) =
                   *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar18 * 0x10)
                   - (delta + lVar23 * *(longdouble *)
                                        ((long)*(col_value *)((long)this + 0x50) + 0x20 + lVar22) *
                                       (longdouble)0.5);
              break;
            }
            piVar18 = (int *)(local_a8._8_8_ + (long)*(int *)((long)cVar10 + 0x30 + lVar22) * 2 * 4)
            ;
            if (*(int *)((long)*(col_value *)((long)this + 0x58) + local_70 * 4 + 4) < iVar14)
            goto LAB_001a1184;
            lVar24 = *(longdouble *)((long)cVar10 + 0x20 + lVar22);
            lVar4 = (longdouble)0;
            if ((lVar24 != lVar4) || (NAN(lVar24) || NAN(lVar4))) {
              if (lVar4 <= lVar24) goto LAB_001a1184;
            }
            else {
              dVar25 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)*(col_value *)this);
              if (0.5 <= dVar25) goto LAB_001a1184;
            }
            bit_array_impl::set(&x->super_bit_array_impl,piVar18[1]);
            cVar10 = *(col_value *)((long)this + 0x50);
            plVar1 = (longdouble *)((long)cVar10 + 0x20 + lVar22);
            lVar22 = lVar22 + 0x20;
            *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar18 * 0x10) =
                 *(longdouble *)((long)*(col_value *)((long)this + 0x68) + (long)*piVar18 * 0x10) +
                 delta + lVar23 * *plVar1 * (longdouble)0.5;
            lVar20 = lVar17 + 1;
          } while (lVar17 + 1 < local_90);
          goto LAB_001a11c2;
        }
      }
      else {
        _Var8._M_head_impl =
             (((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar22 = 0;
        iVar14 = 0;
        local_58 = (long)iVar15 + -2;
        lVar20 = -1;
        do {
          uVar5 = local_a8._8_8_;
          lVar19 = (long)*(int *)((long)&(_Var8._M_head_impl)->id + lVar22);
          iVar14 = iVar14 + *(int *)((long)&(_Var8._M_head_impl)->a + lVar22);
          lVar17 = lVar20 + 1;
          local_90 = CONCAT44(local_90._4_4_,
                              *(undefined4 *)
                               ((long)*(col_value *)((long)this + 0x58) + local_70 * 4));
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_a8._8_8_ + (lVar19 * 2 + 1) * 4));
          _Var8._M_head_impl = *(rc_data **)((long)local_78._M_head_impl + 0x50);
          *(longdouble *)
           (*(long *)((long)local_78._M_head_impl + 0x68) +
           (long)*(int *)(uVar5 + lVar19 * 2 * 4) * 0x10) =
               *(longdouble *)
                (*(long *)((long)local_78._M_head_impl + 0x68) +
                (long)*(int *)(uVar5 + lVar19 * 2 * 4) * 0x10) +
               lVar23 * *(longdouble *)((long)&(_Var8._M_head_impl)->value + lVar22) *
                        (longdouble)0.5 + delta;
          this = (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
                  *)local_78;
          if ((int)(size_type)local_90 <= iVar14) break;
          lVar22 = lVar22 + 0x20;
          bVar6 = lVar20 < local_58;
          lVar20 = lVar17;
        } while (bVar6);
        _Var9._M_head_impl = *(bound_factor **)((long)local_78._M_head_impl + 0x58);
        if ((&(_Var9._M_head_impl)->min)[local_70] <= iVar14) goto LAB_001a1086;
LAB_001a11c2:
        uVar7 = (uint)lVar17;
        iVar11 = uVar7 + 1;
      }
      this = (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
              *)local_78._M_head_impl;
      if (iVar11 < iVar15) {
        cVar10 = local_78._M_head_impl[10];
        lVar17 = (long)(int)uVar7 << 5;
        iVar15 = ~uVar7 + iVar15;
        do {
          uVar5 = local_a8._8_8_;
          lVar20 = (long)*(int *)((long)cVar10 + 0x30 + lVar17);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_a8._8_8_ + (lVar20 * 2 + 1) * 4));
          cVar10 = *(col_value *)((long)this + 0x50);
          plVar1 = (longdouble *)((long)cVar10 + 0x20 + lVar17);
          lVar17 = lVar17 + 0x20;
          iVar15 = iVar15 + -1;
          *(longdouble *)
           ((long)*(col_value *)((long)this + 0x68) + (long)*(int *)(uVar5 + lVar20 * 2 * 4) * 0x10)
               = *(longdouble *)
                  ((long)*(col_value *)((long)this + 0x68) +
                  (long)*(int *)(uVar5 + lVar20 * 2 * 4) * 0x10) -
                 (delta + *plVar1 * (longdouble)0.5 * lVar23);
        } while (iVar15 != 0);
      }
      bVar6 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                          *)this,(int)local_98._M_t.
                                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                      super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (!bVar6) {
LAB_001a1293:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      first._M_current = local_60 + 1;
    } while (first._M_current != local_68);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }